

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O0

BN * __thiscall BN::operator-(BN *__return_storage_ptr__,BN *this,BN *bn)

{
  BN *bn_00;
  BN local_38;
  BN *local_20;
  BN *bn_local;
  BN *this_local;
  
  local_20 = bn;
  bn_local = this;
  this_local = __return_storage_ptr__;
  BN(&local_38,this);
  bn_00 = operator-=(&local_38,bn);
  BN(__return_storage_ptr__,bn_00);
  ~BN(&local_38);
  return __return_storage_ptr__;
}

Assistant:

const BN BN::operator - (const BN& bn) const
{
    return move(BN(*this) -= bn);
}